

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int ecdh_hash_function_sha256(uchar *output,uchar *x32,uchar *y32,void *data)

{
  uchar version;
  secp256k1_sha256 sha;
  byte local_81;
  secp256k1_sha256 local_80;
  
  local_81 = y32[0x1f] & 1 | 2;
  local_80.s[0] = 0x6a09e667;
  local_80.s[1] = 0xbb67ae85;
  local_80.s[2] = 0x3c6ef372;
  local_80.s[3] = 0xa54ff53a;
  local_80.s[4] = 0x510e527f;
  local_80.s[5] = 0x9b05688c;
  local_80.s[6] = 0x1f83d9ab;
  local_80.s[7] = 0x5be0cd19;
  local_80.bytes = 0;
  secp256k1_sha256_write(&local_80,&local_81,1);
  secp256k1_sha256_write(&local_80,x32,0x20);
  secp256k1_sha256_finalize(&local_80,output);
  return 1;
}

Assistant:

static int ecdh_hash_function_sha256(unsigned char *output, const unsigned char *x32, const unsigned char *y32, void *data) {
    unsigned char version = (y32[31] & 0x01) | 0x02;
    secp256k1_sha256 sha;
    (void)data;

    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, &version, 1);
    secp256k1_sha256_write(&sha, x32, 32);
    secp256k1_sha256_finalize(&sha, output);

    return 1;
}